

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

bool __thiscall
World::collidesWithQuads(World *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,Vec2d *offset)

{
  Quad *this_00;
  int iVar1;
  Vec2d **ppVVar2;
  Vec2d *this_01;
  ostream *poVar3;
  long lVar4;
  float fVar5;
  string local_68;
  pointer local_48;
  pointer local_40;
  float local_34;
  
  local_48 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    if (local_48 == local_40) {
LAB_0011b69f:
      return local_48 != local_40;
    }
    this_00 = *local_48;
    lVar4 = 0;
    while( true ) {
      iVar1 = Quad::getVertexCount(this_00);
      if (iVar1 <= lVar4) break;
      ppVVar2 = Quad::getVertices(this_00);
      this_01 = Vec2d::getOffset(ppVVar2[lVar4],offset);
      fVar5 = Vec2d::getY(this_01);
      if (fVar5 < 0.0) {
LAB_0011b64e:
        poVar3 = std::operator<<((ostream *)&std::cout,"Collision with world ");
        Vec2d::toString_abi_cxx11_(&local_68,this_01);
        poVar3 = std::operator<<(poVar3,(string *)&local_68);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_68);
        operator_delete(this_01);
        goto LAB_0011b69f;
      }
      local_34 = Vec2d::getY(this_01);
      fVar5 = Vec2d::getY(this->bounds);
      if (fVar5 < local_34) goto LAB_0011b64e;
      fVar5 = Vec2d::getX(this_01);
      if (fVar5 < 0.0) goto LAB_0011b64e;
      local_34 = Vec2d::getX(this_01);
      fVar5 = Vec2d::getX(this->bounds);
      if (fVar5 < local_34) goto LAB_0011b64e;
      operator_delete(this_01);
      lVar4 = lVar4 + 1;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool World::collidesWithQuads(vector<Quad*>* quads, Vec2d* offset) {
    for (auto quad : *quads) {
        for (int i = 0; i < quad->getVertexCount(); i++) {
            Vec2d* vertex = quad->getVertices()[i]->getOffset(offset);
            if (vertex->getY() < 0 || vertex->getY() > bounds->getY() || vertex->getX() < 0 || vertex->getX() > bounds->getX()) {
                cout << "Collision with world " << vertex->toString() << endl;
                delete vertex;
                return true;
            }
            delete vertex;
        }
    }
    return false;
}